

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void helper_macsatu_m68k(CPUM68KState_conflict *env,uint32_t acc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = env->macc[acc];
  if (0xffffffffffff < uVar2) {
    *(byte *)&env->macsr = (byte)env->macsr | 2;
  }
  uVar1 = env->macsr;
  uVar3 = uVar2;
  if ((uVar1 & 2) != 0) {
    env->macsr = 0x100 << ((byte)acc & 0x1f) | uVar1;
    if ((char)uVar1 < '\0') {
      uVar3 = 0xffffffffffff;
      if (0x20000000000000 < uVar2) {
        uVar3 = 0;
      }
    }
    else {
      uVar3 = uVar2 & 0xffffffffffff;
    }
  }
  env->macc[acc] = uVar3;
  return;
}

Assistant:

void HELPER(macsatu)(CPUM68KState *env, uint32_t acc)
{
    uint64_t val;

    val = env->macc[acc];
    if (val & (0xffffull << 48)) {
        env->macsr |= MACSR_V;
    }
    if (env->macsr & MACSR_V) {
        env->macsr |= MACSR_PAV0 << acc;
        if (env->macsr & MACSR_OMC) {
            if (val > (1ull << 53))
                val = 0;
            else
                val = (1ull << 48) - 1;
        } else {
            val &= ((1ull << 48) - 1);
        }
    }
    env->macc[acc] = val;
}